

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O2

int coda_ascii_cursor_read_double_array
              (coda_cursor *cursor,double *dst,coda_array_ordering array_ordering)

{
  int iVar1;
  int iVar2;
  coda_type *pcVar3;
  coda_array_ordering in_R8D;
  
  pcVar3 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar3->format) {
    pcVar3 = *(coda_type **)&pcVar3->type_class;
  }
  if ((*(coda_type **)(pcVar3 + 1))->format == coda_format_ascii) {
    iVar1 = read_array(cursor,coda_ascii_cursor_read_double,(uint8_t *)dst,8,in_R8D);
    iVar2 = -1;
    if (iVar1 == 0) {
      if ((array_ordering != coda_array_ordering_c) &&
         (iVar2 = transpose_array(cursor,dst,8), iVar2 != 0)) {
        return -1;
      }
      iVar2 = 0;
    }
    return iVar2;
  }
  __assert_fail("type->base_type->format == coda_format_ascii",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                ,0x675,
                "int coda_ascii_cursor_read_double_array(const coda_cursor *, double *, coda_array_ordering)"
               );
}

Assistant:

int coda_ascii_cursor_read_double_array(const coda_cursor *cursor, double *dst, coda_array_ordering array_ordering)
{
    coda_type_array *type = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    assert(type->base_type->format == coda_format_ascii);
    if (read_array(cursor, (read_function)&coda_ascii_cursor_read_double, (uint8_t *)dst, sizeof(double),
                   coda_array_ordering_c) != 0)
    {
        return -1;
    }
    if (array_ordering != coda_array_ordering_c)
    {
        if (transpose_array(cursor, dst, sizeof(double)) != 0)
        {
            return -1;
        }
    }
    return 0;
}